

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool google::protobuf::compiler::anon_unknown_5::ContainsProto3Optional(Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  OneofDescriptor *pOVar4;
  Descriptor *desc_00;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  Descriptor *desc_local;
  
  local_1c = 0;
  do {
    iVar2 = Descriptor::field_count(desc);
    if (iVar2 <= local_1c) {
      local_20 = 0;
      while( true ) {
        iVar2 = Descriptor::nested_type_count(desc);
        if (iVar2 <= local_20) {
          return false;
        }
        desc_00 = Descriptor::nested_type(desc,local_20);
        bVar1 = ContainsProto3Optional(desc_00);
        if (bVar1) break;
        local_20 = local_20 + 1;
      }
      return true;
    }
    pFVar3 = Descriptor::field(desc,local_1c);
    pOVar4 = FieldDescriptor::real_containing_oneof(pFVar3);
    if (pOVar4 == (OneofDescriptor *)0x0) {
      pFVar3 = Descriptor::field(desc,local_1c);
      pOVar4 = FieldDescriptor::containing_oneof(pFVar3);
      if (pOVar4 != (OneofDescriptor *)0x0) {
        return true;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool ContainsProto3Optional(const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); ++i) {
    if (desc->field(i)->real_containing_oneof() == nullptr &&
        desc->field(i)->containing_oneof() != nullptr) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); ++i) {
    if (ContainsProto3Optional(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}